

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O3

Ptr * __thiscall InterpTest::GetFuncExport(Ptr *__return_storage_ptr__,InterpTest *this,Index index)

{
  Instance *pIVar1;
  char *message;
  Index local_44;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  internal local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  AssertHelper local_28;
  
  pIVar1 = (this->inst_).obj_;
  local_40._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)(pIVar1->exports_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pIVar1->exports_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_start >> 3);
  local_44 = index;
  testing::internal::CmpHelperLT<unsigned_int,unsigned_long>
            (local_38,"index","inst_->exports().size()",&local_44,(unsigned_long *)&local_40);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0x2f,message);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  wabt::interp::RefPtr<wabt::interp::DefinedFunc>::RefPtr
            (__return_storage_ptr__,&this->store_,
             (Ref)(((this->inst_).obj_)->exports_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[local_44].index);
  return __return_storage_ptr__;
}

Assistant:

DefinedFunc::Ptr GetFuncExport(interp::Index index) {
    EXPECT_LT(index, inst_->exports().size());
    return store_.UnsafeGet<DefinedFunc>(inst_->exports()[index]);
  }